

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveComplexJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  bool bVar1;
  BufferHandle *pBVar2;
  BufferHandle *pBVar3;
  idx_t iVar4;
  idx_t iVar5;
  __int_type _Var6;
  __int_type _Var7;
  sel_t *psVar8;
  OuterJoinMarker *pOVar9;
  int iVar10;
  pointer pGVar11;
  pointer pGVar12;
  reference pvVar13;
  reference pvVar14;
  type pRVar15;
  const_reference pvVar16;
  data_ptr_t pdVar17;
  data_ptr_t str1;
  reference pvVar18;
  reference other;
  SelectionVector *sel;
  ulong uVar19;
  pointer pRVar20;
  OperatorState *pOVar21;
  ulong uVar22;
  _func_int **pp_Var23;
  idx_t i_1;
  BufferHandle *this_00;
  size_type sVar24;
  _func_int **pp_Var25;
  ulong count;
  bool external;
  data_ptr_t l_ptr;
  BlockMergeInfo right_info;
  BlockMergeInfo left_info;
  SBScanState lread;
  SBScanState rread;
  bool local_2c1;
  DataChunk *local_2c0;
  data_ptr_t local_2b8;
  idx_t local_2b0;
  DataChunk *local_2a8;
  type local_2a0;
  PhysicalPiecewiseMergeJoin *local_298;
  OuterJoinMarker *local_290;
  SelectionVector *local_288;
  pointer local_280;
  data_ptr_t local_278;
  int local_26c;
  GlobalSortState *local_268;
  _func_int **local_260;
  _func_int **local_258;
  OperatorState *local_250;
  SelectionVector local_248;
  OperatorState *local_230;
  DataChunk *local_228;
  vector<duckdb::JoinCondition,_true> *local_220;
  type local_218;
  DataChunk *local_210;
  type local_208;
  idx_t local_200;
  _func_int **local_1f8;
  OperatorState *local_1f0;
  SelectionVector local_1e8;
  DataChunk *local_1d0;
  long local_1c8;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *local_1c0;
  BufferHandle *local_1b8;
  BufferHandle *local_1b0;
  OperatorState *local_1a8;
  OperatorState *local_1a0;
  OperatorState *local_198;
  idx_t local_190;
  ExpressionExecutor *local_188;
  undefined1 local_180 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  _func_int **local_158;
  BufferHandle local_150;
  BufferHandle local_138;
  BufferHandle local_120;
  BufferHandle local_108;
  BufferHandle BStack_f0;
  SBScanState local_d8;
  
  local_2c0 = chunk;
  pGVar11 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                          super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                          sink_state);
  pGVar11 = pGVar11 + 1;
  pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)pGVar11);
  pvVar13 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&(pGVar12->global_sort_state).sorted_blocks,0);
  local_2a0 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator*(pvVar13);
  local_2b0 = (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_1c8 = (long)*(pointer *)
                     ((long)&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions
                             .
                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             .
                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              (long)(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (BufferHandle *)state_p[0x46]._vptr_OperatorState;
  pBVar3 = (BufferHandle *)state_p[0x47]._vptr_OperatorState;
  this_00 = pBVar2;
  local_298 = this;
  local_1d0 = input;
  if (pBVar3 != pBVar2) {
    do {
      BufferHandle::~BufferHandle(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pBVar3);
    state_p[0x47]._vptr_OperatorState = (_func_int **)pBVar2;
  }
  local_2b0 = local_2b0 * 0x4ec4ec4ec4ec4ec5;
  local_220 = &(local_298->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
  local_1c0 = (vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
              (state_p + 0x46);
  local_198 = state_p + 0x24;
  local_230 = state_p + 0x26;
  local_1a0 = state_p + 0x21;
  local_1a8 = state_p + 0x22;
  local_1b8 = &local_d8.payload_heap_handle;
  local_1b0 = &BStack_f0;
  local_210 = (DataChunk *)(state_p + 8);
  local_2a8 = (DataChunk *)(state_p + 0x35);
  local_188 = (ExpressionExecutor *)(state_p + 0x3d);
  local_228 = (DataChunk *)(state_p + 0x2d);
  local_288 = (SelectionVector *)(state_p + 0x2a);
  local_290 = (OuterJoinMarker *)(state_p + 0x10);
  local_280 = pGVar11;
  do {
    pOVar9 = local_290;
    if (*(char *)&state_p[0x25]._vptr_OperatorState == '\x01') {
      PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,local_1d0);
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 0;
      local_230[2]._vptr_OperatorState = (_func_int **)0x0;
      local_230[3]._vptr_OperatorState = (_func_int **)0x0;
      local_230->_vptr_OperatorState = (_func_int **)0x0;
      local_230[1]._vptr_OperatorState = (_func_int **)0x0;
    }
    else if (((ulong)state_p[0x25]._vptr_OperatorState & 0x100) != 0) {
      if ((local_290->enabled == true) &&
         (OuterJoinMarker::ConstructLeftJoinResult(local_290,local_210,local_2c0),
         pOVar9->enabled == true)) {
        switchD_012e5a64::default
                  (state_p[0x11]._vptr_OperatorState,0,(size_t)state_p[0x12]._vptr_OperatorState);
      }
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    local_218 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                             *)local_1a0);
    iVar4 = local_218->count;
    iVar5 = local_218->has_null;
    local_208 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                             *)local_1a8);
    local_200 = 0;
    local_1f0 = local_198;
    local_1f8 = (_func_int **)(iVar4 - iVar5);
    SelectionVector::SelectionVector(&local_1e8,0x800);
    pvVar14 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::operator[](&local_2a0->radix_sorting_data,
                           (size_type)state_p[0x27]._vptr_OperatorState);
    pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator*(pvVar14);
    pp_Var23 = state_p[0x28]._vptr_OperatorState;
    iVar4 = pRVar15->count;
    pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar11);
    _Var6 = (pGVar12->count).super___atomic_base<unsigned_long>._M_i;
    pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar11);
    _Var7 = (pGVar12->has_null).super___atomic_base<unsigned_long>._M_i;
    pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)pGVar11);
    pp_Var25 = (_func_int **)(iVar4 + (long)pp_Var23);
    local_258 = (_func_int **)(_Var6 - _Var7);
    if (local_258 < pp_Var23) {
      local_258 = pp_Var23;
    }
    if (pp_Var25 < local_258) {
      local_258 = pp_Var25;
    }
    local_258 = (_func_int **)((long)local_258 - (long)pp_Var23);
    local_268 = &pGVar12->global_sort_state;
    local_260 = state_p[0x27]._vptr_OperatorState;
    local_250 = local_230;
    SelectionVector::SelectionVector(&local_248,0x800);
    pvVar16 = vector<duckdb::JoinCondition,_true>::operator[](local_220,0);
    local_26c = MergeJoinComparisonValue(pvVar16->comparison);
    bVar1 = (local_268->sort_layout).all_constant;
    local_2c1 = local_208->external;
    SBScanState::SBScanState((SBScanState *)local_180,local_208->buffer_manager,local_208);
    pvVar13 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&local_208->sorted_blocks,0);
    local_168._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (pvVar13->super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)
         ._M_t.super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
         super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    MergeJoinPinSortingBlock((SBScanState *)local_180,local_200);
    local_158 = (_func_int **)0x0;
    pdVar17 = SBScanState::RadixPtr((SBScanState *)local_180);
    local_158 = local_1f0->_vptr_OperatorState;
    str1 = SBScanState::RadixPtr((SBScanState *)local_180);
    local_2b8 = str1;
    SBScanState::SBScanState(&local_d8,local_268->buffer_manager,local_268);
    pvVar13 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&local_268->sorted_blocks,0);
    local_d8.sb = (pvVar13->
                  super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                  .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    if (local_250->_vptr_OperatorState < local_258) {
      MergeJoinPinSortingBlock(&local_d8,(idx_t)local_260);
      local_d8.entry_idx = (idx_t)local_250->_vptr_OperatorState;
      local_278 = SBScanState::RadixPtr(&local_d8);
      local_190 = (local_208->sort_layout).comparison_size;
      iVar4 = (local_208->sort_layout).entry_size;
      pp_Var23 = local_1f0->_vptr_OperatorState;
      count = 0;
      pOVar21 = local_1f0;
      do {
        if (state_p[0x29]._vptr_OperatorState <= pp_Var23) {
          do {
            if (pp_Var23 < local_1f8) {
              if (bVar1 == false) {
                local_d8.entry_idx = (idx_t)local_250->_vptr_OperatorState;
                local_158 = pp_Var23;
                iVar10 = Comparators::CompareTuple
                                   ((SBScanState *)local_180,&local_d8,&local_2b8,&local_278,
                                    &local_208->sort_layout,&local_2c1);
              }
              else {
                iVar10 = FastMemcmp(str1,local_278,local_190);
              }
              pp_Var23 = local_1f0->_vptr_OperatorState;
              pOVar21 = local_1f0;
              if (iVar10 <= local_26c) {
                local_1e8.sel_vector[count] = (sel_t)pp_Var23;
                local_248.sel_vector[count] = *(sel_t *)&local_250->_vptr_OperatorState;
                pp_Var23 = (_func_int **)((long)pp_Var23 + 1);
                local_1f0->_vptr_OperatorState = pp_Var23;
                goto LAB_0154ed72;
              }
            }
            state_p[0x29]._vptr_OperatorState = pp_Var23;
            pp_Var23 = (_func_int **)((long)local_250->_vptr_OperatorState + 1);
            local_250->_vptr_OperatorState = pp_Var23;
            if (local_258 <= pp_Var23) goto LAB_0154edce;
            local_278 = local_278 + iVar4;
            pOVar21->_vptr_OperatorState = (_func_int **)0x0;
            pp_Var23 = pOVar21->_vptr_OperatorState;
            str1 = pdVar17;
            local_2b8 = pdVar17;
          } while (state_p[0x29]._vptr_OperatorState <= pp_Var23);
        }
        local_2b8 = str1;
        local_1e8.sel_vector[count] = (sel_t)pp_Var23;
        local_248.sel_vector[count] = *(sel_t *)&local_250->_vptr_OperatorState;
        pp_Var23 = (_func_int **)((long)pp_Var23 + 1);
        pOVar21->_vptr_OperatorState = pp_Var23;
LAB_0154ed72:
        count = count + 1;
        str1 = local_2b8 + iVar4;
        local_2b8 = str1;
      } while (count != 0x800);
      count = 0x800;
    }
    else {
      count = 0;
    }
LAB_0154edce:
    BufferHandle::~BufferHandle(local_1b8);
    BufferHandle::~BufferHandle(&local_d8.payload_data_handle);
    BufferHandle::~BufferHandle(&local_d8.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_d8.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_d8.radix_handle);
    BufferHandle::~BufferHandle(local_1b0);
    BufferHandle::~BufferHandle(&local_108);
    BufferHandle::~BufferHandle(&local_120);
    BufferHandle::~BufferHandle(&local_138);
    BufferHandle::~BufferHandle(&local_150);
    if (count == 0) {
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      state_p[0x26]._vptr_OperatorState = (_func_int **)0x0;
      pvVar14 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&local_2a0->radix_sorting_data,
                             (size_type)state_p[0x27]._vptr_OperatorState);
      pRVar20 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar14);
      state_p[0x28]._vptr_OperatorState =
           (_func_int **)((long)state_p[0x28]._vptr_OperatorState + pRVar20->count);
      pp_Var23 = (_func_int **)((long)state_p[0x27]._vptr_OperatorState + 1);
      state_p[0x27]._vptr_OperatorState = pp_Var23;
      if ((_func_int **)
          ((long)(local_2a0->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_2a0->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) <= pp_Var23) {
        *(undefined1 *)((long)&state_p[0x25]._vptr_OperatorState + 1) = 1;
      }
    }
    else {
      DataChunk::Reset(local_2c0);
      if (state_p[9]._vptr_OperatorState != state_p[8]._vptr_OperatorState) {
        sVar24 = 0;
        do {
          pvVar18 = vector<duckdb::Vector,_true>::operator[](&local_2c0->data,sVar24);
          other = vector<duckdb::Vector,_true>::operator[](&local_210->data,sVar24);
          Vector::Slice(pvVar18,other,&local_1e8,count);
          sVar24 = sVar24 + 1;
        } while (sVar24 < (ulong)(((long)state_p[9]._vptr_OperatorState -
                                   (long)state_p[8]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5))
        ;
      }
      PhysicalRangeJoin::SliceSortedPayload
                ((BufferHandle *)local_180,local_2c0,local_268,(idx_t)local_260,&local_248,count,
                 local_2b0);
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
      emplace_back<duckdb::BufferHandle>(local_1c0,(BufferHandle *)local_180);
      BufferHandle::~BufferHandle((BufferHandle *)local_180);
      local_2c0->count = count;
      sel = FlatVector::IncrementalSelectionVector();
      if (local_1c8 == 0x18) {
LAB_0154f172:
        bVar1 = true;
        if (local_290->enabled == true) {
          psVar8 = sel->sel_vector;
          uVar19 = 0;
          do {
            uVar22 = uVar19;
            if (psVar8 != (sel_t *)0x0) {
              uVar22 = (ulong)psVar8[uVar19];
            }
            if (local_290->enabled == true) {
              *(undefined1 *)
               ((long)state_p[0x11]._vptr_OperatorState + (ulong)local_1e8.sel_vector[uVar22]) = 1;
            }
            uVar19 = uVar19 + 1;
          } while (count != uVar19);
        }
      }
      else {
        DataChunk::Split(local_2c0,local_2a8,local_2b0);
        state_p[0x40]._vptr_OperatorState = (_func_int **)local_2a8;
        DataChunk::Reset(local_228);
        uVar19 = count;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&(local_298->super_PhysicalRangeJoin).
                                        super_PhysicalComparisonJoin.conditions.
                                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                        .
                                        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         (long)(local_298->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                               conditions.
                               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               .
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       )) {
          local_218 = (type)&local_218->keys;
          sVar24 = 1;
          do {
            pvVar18 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)local_218,sVar24);
            Vector::Vector((Vector *)local_180,pvVar18);
            Vector::Slice((Vector *)local_180,&local_1e8,count);
            pvVar18 = vector<duckdb::Vector,_true>::operator[](&local_228->data,sVar24);
            ExpressionExecutor::ExecuteExpression(local_188,sVar24,pvVar18);
            if (uVar19 < count) {
              Vector::Slice((Vector *)local_180,sel,uVar19);
              Vector::Slice(pvVar18,sel,uVar19);
            }
            pvVar16 = vector<duckdb::JoinCondition,_true>::operator[](local_220,sVar24);
            uVar19 = PhysicalRangeJoin::SelectJoinTail
                               (&pvVar16->comparison,(Vector *)local_180,pvVar18,sel,uVar19,
                                local_288);
            if (local_120.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_120.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
            }
            if (local_138.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_150.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            LogicalType::~LogicalType((LogicalType *)(local_180 + 8));
            sVar24 = sVar24 + 1;
            sel = local_288;
          } while (sVar24 < (ulong)(((long)*(pointer *)
                                            ((long)&(local_298->super_PhysicalRangeJoin).
                                                    super_PhysicalComparisonJoin.conditions.
                                                                                                        
                                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                                  .
                                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)(local_298->super_PhysicalRangeJoin).
                                           super_PhysicalComparisonJoin.conditions.
                                           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                           .
                                           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
        DataChunk::Fuse(local_2c0,local_2a8);
        if (count <= uVar19) goto LAB_0154f172;
        if (uVar19 != 0) {
          DataChunk::Slice(local_2c0,sel,uVar19);
          count = uVar19;
          goto LAB_0154f172;
        }
        DataChunk::Reset(local_2c0);
        bVar1 = false;
        count = 0;
      }
      pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)local_280);
      if (bVar1 && (pGVar12->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
                   _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) {
        uVar19 = 0;
        do {
          pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                                  *)local_280);
          uVar22 = uVar19;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)sel->sel_vector[uVar19];
          }
          *(bool *)((long)state_p[0x28]._vptr_OperatorState +
                   (long)((pGVar12->found_match).
                          super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                          super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                         local_248.sel_vector[uVar22])) = true;
          uVar19 = uVar19 + 1;
        } while (count != uVar19);
      }
      local_2c0->count = count;
      DataChunk::Verify(local_2c0);
    }
    if (local_248.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_248.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pGVar11 = local_280;
    if (local_1e8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2c0->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalPiecewiseMergeJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &input,
                                                                  DataChunk &chunk, OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();
	auto &rsorted = *gstate.table->global_sort_state.sorted_blocks[0];
	const auto left_cols = input.ColumnCount();
	const auto tail_cols = conditions.size() - 1;

	state.payload_heap_handles.clear();
	do {
		if (state.first_fetch) {
			state.ResolveJoinKeys(input);

			state.right_chunk_index = 0;
			state.right_base = 0;
			state.left_position = 0;
			state.prev_left_index = 0;
			state.right_position = 0;
			state.first_fetch = false;
			state.finished = false;
		}
		if (state.finished) {
			if (state.left_outer.Enabled()) {
				// left join: before we move to the next chunk, see if we need to output any vectors that didn't
				// have a match found
				state.left_outer.ConstructLeftJoinResult(state.lhs_payload, chunk);
				state.left_outer.Reset();
			}
			state.first_fetch = true;
			state.finished = false;
			return OperatorResultType::NEED_MORE_INPUT;
		}

		auto &lhs_table = *state.lhs_local_table;
		const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
		BlockMergeInfo left_info(*state.lhs_global_state, 0, state.left_position, lhs_not_null);

		const auto &rblock = *rsorted.radix_sorting_data[state.right_chunk_index];
		const auto rhs_not_null =
		    SortedBlockNotNull(state.right_base, rblock.count, gstate.table->count - gstate.table->has_null);
		BlockMergeInfo right_info(gstate.table->global_sort_state, state.right_chunk_index, state.right_position,
		                          rhs_not_null);

		idx_t result_count =
		    MergeJoinComplexBlocks(left_info, right_info, conditions[0].comparison, state.prev_left_index);
		if (result_count == 0) {
			// exhausted this chunk on the right side
			// move to the next right chunk
			state.left_position = 0;
			state.right_position = 0;
			state.right_base += rsorted.radix_sorting_data[state.right_chunk_index]->count;
			state.right_chunk_index++;
			if (state.right_chunk_index >= rsorted.radix_sorting_data.size()) {
				state.finished = true;
			}
		} else {
			// found matches: extract them
			chunk.Reset();
			for (idx_t c = 0; c < state.lhs_payload.ColumnCount(); ++c) {
				chunk.data[c].Slice(state.lhs_payload.data[c], left_info.result, result_count);
			}
			state.payload_heap_handles.push_back(SliceSortedPayload(chunk, right_info.state, right_info.block_idx,
			                                                        right_info.result, result_count, left_cols));
			chunk.SetCardinality(result_count);

			auto sel = FlatVector::IncrementalSelectionVector();
			if (tail_cols) {
				// If there are more expressions to compute,
				// split the result chunk into the left and right halves
				// so we can compute the values for comparison.
				chunk.Split(state.rhs_input, left_cols);
				state.rhs_executor.SetChunk(state.rhs_input);
				state.rhs_keys.Reset();

				auto tail_count = result_count;
				for (size_t cmp_idx = 1; cmp_idx < conditions.size(); ++cmp_idx) {
					Vector left(lhs_table.keys.data[cmp_idx]);
					left.Slice(left_info.result, result_count);

					auto &right = state.rhs_keys.data[cmp_idx];
					state.rhs_executor.ExecuteExpression(cmp_idx, right);

					if (tail_count < result_count) {
						left.Slice(*sel, tail_count);
						right.Slice(*sel, tail_count);
					}
					tail_count =
					    SelectJoinTail(conditions[cmp_idx].comparison, left, right, sel, tail_count, &state.sel);
					sel = &state.sel;
				}
				chunk.Fuse(state.rhs_input);

				if (tail_count < result_count) {
					result_count = tail_count;
					if (result_count == 0) {
						// Need to reset here otherwise we may use the non-flat chunk when constructing LEFT/OUTER
						chunk.Reset();
					} else {
						chunk.Slice(*sel, result_count);
					}
				}
			}

			// found matches: mark the found matches if required
			if (state.left_outer.Enabled()) {
				for (idx_t i = 0; i < result_count; i++) {
					state.left_outer.SetMatch(left_info.result[sel->get_index(i)]);
				}
			}
			if (gstate.table->found_match) {
				//	Absolute position of the block + start position inside that block
				for (idx_t i = 0; i < result_count; i++) {
					gstate.table->found_match[state.right_base + right_info.result[sel->get_index(i)]] = true;
				}
			}
			chunk.SetCardinality(result_count);
			chunk.Verify();
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}